

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

translation_t *
opengv::relative_pose::twopt
          (translation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,bool unrotate,
          size_t index0,size_t index1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined7 in_register_00000011;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  bearingVector_t f1prime;
  bearingVector_t f2prime;
  bearingVector_t f1;
  bearingVector_t f2;
  undefined1 local_a8 [16];
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_68,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[3])(local_a8,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_48,adapter,index1);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_88,adapter,index1);
  if ((int)CONCAT71(in_register_00000011,unrotate) != 0) {
    auVar12 = *(undefined1 (*) [16])
               (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array;
    auVar1 = *(undefined1 (*) [16])
              ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array + 3);
    auVar18 = *(undefined1 (*) [16])
               ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array + 6);
    dVar13 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
    auVar25._8_8_ = local_98;
    auVar25._0_8_ = local_98;
    auVar10._8_8_ = local_a8._0_8_;
    auVar10._0_8_ = local_a8._0_8_;
    auVar10 = vmulpd_avx512vl(auVar12,auVar10);
    auVar11._8_8_ = local_a8._8_8_;
    auVar11._0_8_ = local_a8._8_8_;
    auVar10 = vfmadd231pd_avx512vl(auVar10,auVar1,auVar11);
    auVar25 = vfmadd231pd_fma(auVar10,auVar18,auVar25);
    auVar10 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((adapter->_R12).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 2),
                          (adapter->_R12).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[5]);
    auVar29._0_8_ = auVar10._0_8_ * (double)local_a8._0_8_;
    auVar29._8_8_ = auVar10._8_8_ * (double)local_a8._8_8_;
    auVar11 = vshufpd_avx(auVar29,auVar29,1);
    local_98 = auVar29._0_8_ + auVar11._0_8_ + local_98 * dVar13;
    auVar26._8_8_ = local_78;
    auVar26._0_8_ = local_78;
    auVar3._8_8_ = local_88;
    auVar3._0_8_ = local_88;
    auVar11 = vmulpd_avx512vl(auVar12,auVar3);
    auVar12._8_8_ = dStack_80;
    auVar12._0_8_ = dStack_80;
    auVar12 = vfmadd231pd_avx512vl(auVar11,auVar1,auVar12);
    auVar1 = vfmadd231pd_fma(auVar12,auVar26,auVar18);
    auVar18._0_8_ = auVar10._0_8_ * local_88;
    auVar18._8_8_ = auVar10._8_8_ * dStack_80;
    auVar12 = vshufpd_avx(auVar18,auVar18,1);
    local_78 = auVar18._0_8_ + auVar12._0_8_ + dVar13 * local_78;
    local_88 = auVar1._0_8_;
    dStack_80 = auVar1._8_8_;
    local_a8 = auVar25;
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_98;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_58;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_88;
  auVar7._8_8_ = dStack_60;
  auVar7._0_8_ = local_68;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = dStack_60;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_58 * (double)local_a8._8_8_;
  auVar11 = vfmsub231sd_fma(auVar23,auVar19,auVar1);
  auVar12 = vunpcklpd_avx(auVar19,local_a8);
  auVar28._0_8_ = auVar12._0_8_ * local_68;
  auVar28._8_8_ = auVar12._8_8_ * dStack_60;
  auVar12 = vunpcklpd_avx(auVar20,auVar7);
  auVar18 = vfmsub213pd_fma(auVar12,local_a8,auVar28);
  auVar6._8_8_ = local_78;
  auVar6._0_8_ = dStack_80;
  auVar9._8_8_ = dStack_40;
  auVar9._0_8_ = local_48;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_38;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_48 * local_78;
  auVar25 = vfmsub231sd_fma(auVar30,auVar14,auVar2);
  auVar12 = vunpcklpd_avx(auVar14,auVar6);
  auVar15._0_8_ = auVar12._0_8_ * dStack_40;
  auVar15._8_8_ = auVar12._8_8_ * local_38;
  auVar10 = vfmsub231pd_fma(auVar15,auVar9,auVar6);
  auVar12 = vshufpd_avx(auVar18,auVar11,1);
  auVar1 = vunpcklpd_avx(auVar25,auVar10);
  auVar21._0_8_ = auVar1._0_8_ * auVar12._0_8_;
  auVar21._8_8_ = auVar1._8_8_ * auVar12._8_8_;
  auVar1 = vfmsub231pd_fma(auVar21,auVar18,auVar10);
  auVar12 = vshufpd_avx(auVar10,auVar10,1);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar12._0_8_ * auVar18._0_8_;
  auVar18 = vfmsub231sd_fma(auVar16,auVar11,auVar25);
  dVar13 = auVar18._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar13 * dVar13 + auVar1._0_8_ * auVar1._0_8_ + auVar1._8_8_ * auVar1._8_8_;
  auVar12 = vsqrtpd_avx(auVar24);
  dVar22 = auVar12._0_8_;
  auVar27._8_8_ = dVar22;
  auVar27._0_8_ = dVar22;
  auVar12 = vdivpd_avx(auVar1,auVar27);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar12;
  auVar17._0_8_ = dVar13 / dVar22;
  auVar17._8_8_ = auVar18._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = auVar17._0_8_;
  auVar8._8_8_ = dStack_60;
  auVar8._0_8_ = local_68;
  auVar1 = vsubpd_avx(auVar8,local_a8);
  if ((local_58 - local_98) * auVar17._0_8_ +
      auVar1._0_8_ * auVar12._0_8_ + auVar1._8_8_ * auVar12._8_8_ < 0.0) {
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(*(undefined1 (*) [16])
                               (__return_storage_ptr__->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array,auVar4);
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
     m_storage.m_data.array = auVar12;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar17,auVar5);
    dVar13 = (double)vmovlpd_avx(auVar12);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = dVar13;
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::translation_t
opengv::relative_pose::twopt(
    const RelativeAdapterBase & adapter,
    bool unrotate,
    size_t index0,
    size_t index1 )
{
  bearingVector_t f1 = adapter.getBearingVector1(index0);
  bearingVector_t f1prime = adapter.getBearingVector2(index0);
  bearingVector_t f2 = adapter.getBearingVector1(index1);
  bearingVector_t f2prime = adapter.getBearingVector2(index1);

  if(unrotate)
  {
    rotation_t R12 = adapter.getR12();
    f1prime = R12 * f1prime;
    f2prime = R12 * f2prime;
  }

  Eigen::Vector3d normal1 = f1.cross(f1prime);
  Eigen::Vector3d normal2 = f2.cross(f2prime);

  translation_t translation = normal1.cross(normal2);
  translation = translation/translation.norm();

  Eigen::Vector3d opticalFlow = f1 - f1prime;
  if( opticalFlow.dot(translation) < 0 )
    translation = -translation;

  return translation;
}